

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Array<kj::(anonymous_namespace)::TestObject> * __thiscall
kj::Arena::allocateOwnArray<kj::(anonymous_namespace)::TestObject>
          (Array<kj::(anonymous_namespace)::TestObject> *__return_storage_ptr__,Arena *this,
          size_t size)

{
  int iVar1;
  Array<kj::(anonymous_namespace)::TestObject> *result;
  Fault f;
  DebugComparison<int_&,_int_&> _kjCondition;
  Fault local_60;
  Array<kj::(anonymous_namespace)::TestObject> *local_58;
  Array<kj::(anonymous_namespace)::TestObject> *local_50;
  long local_48;
  undefined8 *local_40;
  DebugComparison<int_&,_int_&> local_38;
  
  local_58 = (Array<kj::(anonymous_namespace)::TestObject> *)allocateBytes(this,size * 4,4,false);
  local_48 = (long)&local_58->ptr + size * 4;
  local_40 = &DestructorOnlyArrayDisposer::instance;
  local_50 = local_58;
  if (size != 0) {
    do {
      iVar1 = (anonymous_namespace)::TestObject::count;
      *(int *)&local_50->ptr = (anonymous_namespace)::TestObject::count;
      local_38.right = &(anonymous_namespace)::TestObject::throwAt;
      local_38.op.content.ptr = " != ";
      local_38.op.content.size_ = 5;
      local_38.result = iVar1 != (anonymous_namespace)::TestObject::throwAt;
      if (iVar1 == (anonymous_namespace)::TestObject::throwAt) {
        local_38.left = (int *)local_50;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int&>&>
                  (&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                   ,0x21,FAILED,"index != throwAt","_kjCondition,",&local_38);
        kj::_::Debug::Fault::fatal(&local_60);
      }
      (anonymous_namespace)::TestObject::count = iVar1 + 1;
      local_50 = (Array<kj::(anonymous_namespace)::TestObject> *)((long)&local_50->ptr + 4);
      size = size - 1;
    } while (size != 0);
  }
  __return_storage_ptr__->ptr = (TestObject *)local_58;
  __return_storage_ptr__->size_ = (long)local_50 - (long)local_58 >> 2;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&DestructorOnlyArrayDisposer::instance;
  return local_58;
}

Assistant:

Array<T> Arena::allocateOwnArray(size_t size) {
  ArrayBuilder<T> result = allocateOwnArrayBuilder<T>(size);
  for (size_t i = 0; i < size; i++) {
    result.add();
  }
  return result.finish();
}